

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

SynchEvent * absl::GetSynchEvent(void *addr)

{
  uint uVar1;
  uint uVar2;
  SynchEvent *pSVar3;
  bool bVar4;
  
  if ((synch_event_mu & 1) == 0) {
    uVar2 = synch_event_mu | 1;
    LOCK();
    UNLOCK();
    uVar1 = synch_event_mu & 1;
    synch_event_mu = uVar2;
    if (uVar1 == 0) goto LAB_00143085;
  }
  base_internal::SpinLock::SlowLock((SpinLock *)&synch_event_mu);
LAB_00143085:
  pSVar3 = *(SynchEvent **)(synch_event + ((long)addr % 0x407 & 0xffffffffU) * 8);
  do {
    if (pSVar3 == (SynchEvent *)0x0) {
      pSVar3 = (SynchEvent *)0x0;
LAB_001430bf:
      uVar1 = synch_event_mu;
      uVar2 = synch_event_mu & 2;
      LOCK();
      UNLOCK();
      bVar4 = 7 < synch_event_mu;
      synch_event_mu = uVar2;
      if (bVar4) {
        base_internal::SpinLock::SlowUnlock((SpinLock *)&synch_event_mu,uVar1);
      }
      return pSVar3;
    }
    if ((pSVar3->masked_addr ^ (ulong)addr) == 0xf03a5f7bf03a5f7b) {
      pSVar3->refcount = pSVar3->refcount + 1;
      goto LAB_001430bf;
    }
    pSVar3 = pSVar3->next;
  } while( true );
}

Assistant:

static SynchEvent *GetSynchEvent(const void *addr) {
  uint32_t h = reinterpret_cast<intptr_t>(addr) % kNSynchEvent;
  SynchEvent *e;
  synch_event_mu.Lock();
  for (e = synch_event[h];
       e != nullptr && e->masked_addr != base_internal::HidePtr(addr);
       e = e->next) {
  }
  if (e != nullptr) {
    e->refcount++;
  }
  synch_event_mu.Unlock();
  return e;
}